

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicStruct::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,Field field)

{
  ushort uVar1;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Field field_08;
  void *pvVar2;
  StructDataBitCount SVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  Orphan<capnp::DynamicValue> *pOVar6;
  StructSchema SVar7;
  bool bVar8;
  short sVar9;
  Schema SVar10;
  ulong uVar11;
  uint uVar12;
  Type TVar13;
  Field field_1;
  BuilderFor<capnp::DynamicStruct> src;
  Orphan<capnp::DynamicStruct> result;
  Builder dst;
  undefined1 local_358 [8];
  undefined1 auStack_350 [72];
  Orphan<capnp::DynamicValue> local_308;
  undefined7 uStack_2d0;
  undefined1 uStack_2c9;
  undefined7 uStack_2c8;
  undefined1 local_2c0 [24];
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  Orphan<capnp::DynamicValue> *local_280;
  Schema local_278;
  anon_union_56_12_1c583c3a_for_Builder_1 aStack_270;
  BuilderFor<DynamicStruct> local_238;
  Builder local_208;
  BuilderArena *local_1c8;
  CapTableBuilder *pCStack_1c0;
  WirePointer *local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  StructSchema local_188;
  char *pcStack_180;
  SegmentReader *local_178;
  CapTableReader *pCStack_170;
  byte *local_168;
  WirePointer *pWStack_160;
  long local_158;
  StructSchema local_148;
  char *pcStack_140;
  SegmentReader *local_138;
  CapTableReader *pCStack_130;
  byte *local_128;
  WirePointer *pWStack_120;
  long local_118;
  Schema local_108;
  char *pcStack_100;
  SegmentReader *local_f8;
  CapTableReader *pCStack_f0;
  byte *local_e8;
  WirePointer *pWStack_e0;
  long local_d8;
  undefined8 uStack_d0;
  Orphan<capnp::DynamicStruct> local_c0;
  Builder local_98;
  Reader local_68;
  
  pvVar2 = field.proto._reader.data;
  SVar3 = field.proto._reader.dataSize;
  if (field.proto._reader.dataSize < 0x50) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(short *)((long)field.proto._reader.data + 8);
  }
  if (sVar9 == 1) {
    get((Builder *)local_358,this,field);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_238,(Builder *)local_358);
    uVar5 = auStack_350._8_8_;
    if ((local_358._0_4_ == CAPABILITY) &&
       ((SegmentBuilder *)auStack_350._8_8_ != (SegmentBuilder *)0x0)) {
      auStack_350._8_8_ = (char *)0x0;
      (*(code *)**(undefined8 **)auStack_350._0_8_)
                (auStack_350._0_8_,(char *)(uVar5 + *(long *)(*(long *)uVar5 + -0x10)));
    }
    auStack_350._24_8_ = *(undefined8 *)&(this->builder).dataSize;
    local_358 = (undefined1  [8])(this->builder).segment;
    auStack_350._0_8_ = (this->builder).capTable;
    auStack_350._8_8_ = (this->builder).data;
    auStack_350._16_8_ = (this->builder).pointers;
    SVar10.raw = (RawBrandedSchema *)capnp::_::StructBuilder::getArena((StructBuilder *)local_358);
    auStack_350._0_8_ = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_358);
    local_358 = (undefined1  [8])SVar10.raw;
    Orphanage::newOrphan(&local_c0,(Orphanage *)local_358,local_238.schema);
    Orphan<capnp::DynamicStruct>::get(&local_98,&local_c0);
    which((Maybe<capnp::StructSchema::Field> *)local_358,&local_238);
    if (local_358[0] == true) {
      uStack_d0 = CONCAT44(auStack_350._60_4_,auStack_350._56_4_);
      local_308.builder.location._7_1_ = (undefined1)auStack_350._48_8_;
      uStack_2d0 = SUB87(auStack_350._48_8_,1);
      uStack_2c9 = (undefined1)auStack_350._56_4_;
      uStack_2c8 = (undefined7)((ulong)uStack_d0 >> 8);
      local_308.builder.segment._7_1_ = (undefined1)auStack_350._32_8_;
      local_308.builder.capTable._0_7_ = SUB87(auStack_350._32_8_,1);
      local_308.builder.capTable._7_1_ = (undefined1)auStack_350._40_8_;
      local_308.builder.location._0_7_ = SUB87(auStack_350._40_8_,1);
      local_308.field_1.field9[0xf] = (undefined1)auStack_350._16_8_;
      local_308.builder.tag.content._0_7_ = SUB87(auStack_350._16_8_,1);
      local_308.builder.tag.content._7_1_ = (undefined1)auStack_350._24_8_;
      local_308.builder.segment._0_7_ = SUB87(auStack_350._24_8_,1);
      local_308._7_1_ = SUB81(auStack_350._0_8_,0);
      local_308.field_1.intValue._0_4_ = SUB84(auStack_350._0_8_,1);
      local_308.field_1.intValue._4_3_ = SUB83(auStack_350._0_8_,5);
      local_308.field_1.field9[7] = (undefined1)auStack_350._8_8_;
      local_308.field_1._8_7_ = SUB87(auStack_350._8_8_,1);
      local_108.raw = (RawBrandedSchema *)auStack_350._0_8_;
      pcStack_100 = (char *)auStack_350._8_8_;
      local_f8 = (SegmentReader *)auStack_350._16_8_;
      pCStack_f0 = (CapTableReader *)auStack_350._24_8_;
      local_e8 = (byte *)auStack_350._32_8_;
      pWStack_e0 = (WirePointer *)auStack_350._40_8_;
      local_d8 = auStack_350._48_8_;
      local_118 = auStack_350._48_8_;
      local_128 = (byte *)auStack_350._32_8_;
      pWStack_120 = (WirePointer *)auStack_350._40_8_;
      local_138 = (SegmentReader *)auStack_350._16_8_;
      pCStack_130 = (CapTableReader *)auStack_350._24_8_;
      local_148.super_Schema.raw = (Schema)(Schema)auStack_350._0_8_;
      pcStack_140 = (char *)auStack_350._8_8_;
      field_01._8_8_ = auStack_350._8_8_;
      field_01.parent.super_Schema.raw = (Schema)(Schema)auStack_350._0_8_;
      field_01.proto._reader.segment = (SegmentReader *)auStack_350._16_8_;
      field_01.proto._reader.capTable = (CapTableReader *)auStack_350._24_8_;
      field_01.proto._reader.data = (void *)auStack_350._32_8_;
      field_01.proto._reader.pointers = (WirePointer *)auStack_350._40_8_;
      field_01.proto._reader.dataSize = auStack_350._48_4_;
      field_01.proto._reader.pointerCount = auStack_350._52_2_;
      field_01.proto._reader._38_2_ = auStack_350._54_2_;
      field_01.proto._reader._40_8_ = uStack_d0;
      disown((Orphan<capnp::DynamicValue> *)local_358,&local_238,field_01);
      field_02._8_8_ = pcStack_100;
      field_02.parent.super_Schema.raw = (Schema)(Schema)local_108.raw;
      field_02.proto._reader.segment = local_f8;
      field_02.proto._reader.capTable = pCStack_f0;
      field_02.proto._reader.data = local_e8;
      field_02.proto._reader.pointers = pWStack_e0;
      field_02.proto._reader.dataSize = (undefined4)local_d8;
      field_02.proto._reader.pointerCount = local_d8._4_2_;
      field_02.proto._reader._38_2_ = local_d8._6_2_;
      field_02.proto._reader._40_8_ = uStack_d0;
      adopt(&local_98,field_02,(Orphan<capnp::DynamicValue> *)local_358);
      if ((CapTableReader *)auStack_350._24_8_ != (CapTableReader *)0x0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(auStack_350 + 0x10));
      }
    }
    StructSchema::getFieldByDiscriminant
              ((Maybe<capnp::StructSchema::Field> *)local_358,&local_238.schema,0);
    if (local_358[0] == true) {
      local_308.builder.location._7_1_ = (undefined1)auStack_350._48_8_;
      uStack_2d0 = SUB87(auStack_350._48_8_,1);
      uStack_2c9 = (undefined1)auStack_350._56_4_;
      uStack_2c8 = (undefined7)(CONCAT44(auStack_350._60_4_,auStack_350._56_4_) >> 8);
      local_308.builder.segment._7_1_ = (undefined1)auStack_350._32_8_;
      local_308.builder.capTable._0_7_ = SUB87(auStack_350._32_8_,1);
      local_308.builder.capTable._7_1_ = (undefined1)auStack_350._40_8_;
      local_308.builder.location._0_7_ = SUB87(auStack_350._40_8_,1);
      local_308.field_1.field9[0xf] = (undefined1)auStack_350._16_8_;
      local_308.builder.tag.content._0_7_ = SUB87(auStack_350._16_8_,1);
      local_308.builder.tag.content._7_1_ = (undefined1)auStack_350._24_8_;
      local_308.builder.segment._0_7_ = SUB87(auStack_350._24_8_,1);
      local_308._7_1_ = SUB81(auStack_350._0_8_,0);
      local_308.field_1.intValue._0_4_ = SUB84(auStack_350._0_8_,1);
      local_308.field_1.intValue._4_3_ = SUB83(auStack_350._0_8_,5);
      local_308.field_1.field9[7] = (undefined1)auStack_350._8_8_;
      local_308.field_1._8_7_ = SUB87(auStack_350._8_8_,1);
      local_188.super_Schema.raw = (Schema)(Schema)auStack_350._0_8_;
      pcStack_180 = (char *)auStack_350._8_8_;
      local_178 = (SegmentReader *)auStack_350._16_8_;
      pCStack_170 = (CapTableReader *)auStack_350._24_8_;
      local_168 = (byte *)auStack_350._32_8_;
      pWStack_160 = (WirePointer *)auStack_350._40_8_;
      local_158 = auStack_350._48_8_;
      field_03._8_8_ = auStack_350._8_8_;
      field_03.parent.super_Schema.raw = (Schema)(Schema)auStack_350._0_8_;
      field_03.proto._reader.segment = (SegmentReader *)auStack_350._16_8_;
      field_03.proto._reader.capTable = (CapTableReader *)auStack_350._24_8_;
      field_03.proto._reader.data = (void *)auStack_350._32_8_;
      field_03.proto._reader.pointers = (WirePointer *)auStack_350._40_8_;
      field_03.proto._reader.dataSize = auStack_350._48_4_;
      field_03.proto._reader.pointerCount = auStack_350._52_2_;
      field_03.proto._reader._38_2_ = auStack_350._54_2_;
      field_03.proto._reader._40_8_ = CONCAT44(auStack_350._60_4_,auStack_350._56_4_);
      clear(&local_238,field_03);
    }
    local_280 = __return_storage_ptr__;
    StructSchema::getNonUnionFields((FieldSubset *)local_358,&local_238.schema);
    if ((ulong)(uint)auStack_350._56_4_ != 0) {
      uVar11 = 0;
      do {
        auVar4 = local_358;
        uVar1 = *(ushort *)(auStack_350._48_8_ + uVar11 * 2);
        uVar12 = CONCAT22(0,uVar1);
        capnp::_::ListReader::getStructElement
                  ((StructReader *)(local_2c0 + 0x10),(ListReader *)auStack_350,(uint)uVar1);
        SVar7.super_Schema.raw = local_238.schema.super_Schema.raw;
        local_2c0._0_8_ = auVar4;
        local_2c0._8_4_ = uVar12;
        local_308.builder.location._0_7_ = (undefined7)local_290;
        local_308.builder.location._7_1_ = (undefined1)((ulong)local_290 >> 0x38);
        uStack_2d0 = (undefined7)uStack_288;
        uStack_2c9 = (undefined1)((ulong)uStack_288 >> 0x38);
        local_308.builder.segment._0_7_ = (undefined7)local_2a0;
        local_308.builder.segment._7_1_ = (undefined1)((ulong)local_2a0 >> 0x38);
        local_308.builder.capTable._0_7_ = (undefined7)uStack_298;
        local_308.builder.capTable._7_1_ = (undefined1)((ulong)uStack_298 >> 0x38);
        local_308.field_1._8_7_ = (undefined7)local_2c0._16_8_;
        local_308.field_1.field9[0xf] = SUB81(local_2c0._16_8_,7);
        local_308.builder.tag.content._0_7_ = (undefined7)uStack_2a8;
        local_308.builder.tag.content._7_1_ = (undefined1)((ulong)uStack_2a8 >> 0x38);
        local_308._0_7_ = auVar4._0_7_;
        local_308._7_1_ = auVar4[7];
        local_308.field_1.intValue._4_4_ = local_2c0._12_4_;
        local_308.field_1.intValue._0_4_ = uVar12;
        capnp::_::StructBuilder::asReader(&local_238.builder);
        local_68.schema.super_Schema.raw = SVar7.super_Schema.raw;
        field_04.parent.super_Schema.raw._7_1_ = local_308._7_1_;
        field_04.parent.super_Schema.raw._0_4_ = local_308.type;
        field_04.parent.super_Schema.raw._4_3_ = local_308._4_3_;
        field_04._12_4_ = local_308.field_1.intValue._4_4_;
        field_04.index = local_308.field_1.intValue._0_4_;
        field_04.proto._reader.segment._7_1_ = local_308.field_1.field9[0xf];
        field_04.proto._reader.segment._0_7_ = local_308.field_1._8_7_;
        field_04.proto._reader.capTable._7_1_ = local_308.builder.tag.content._7_1_;
        field_04.proto._reader.capTable._0_7_ = (undefined7)local_308.builder.tag.content;
        field_04.proto._reader.data._7_1_ = local_308.builder.segment._7_1_;
        field_04.proto._reader.data._0_7_ = local_308.builder.segment._0_7_;
        field_04.proto._reader.pointers._7_1_ = local_308.builder.capTable._7_1_;
        field_04.proto._reader.pointers._0_7_ = local_308.builder.capTable._0_7_;
        field_04.proto._reader._39_1_ = local_308.builder.location._7_1_;
        field_04.proto._reader.dataSize = local_308.builder.location._0_4_;
        field_04.proto._reader.pointerCount = local_308.builder.location._4_2_;
        field_04.proto._reader._38_1_ = local_308.builder.location._6_1_;
        field_04.proto._reader._47_1_ = uStack_2c9;
        field_04.proto._reader._40_7_ = uStack_2d0;
        bVar8 = DynamicStruct::Reader::has(&local_68,field_04,NON_NULL);
        if (bVar8) {
          local_198 = local_290;
          uStack_190 = uStack_288;
          local_1a8 = local_2a0;
          uStack_1a0 = uStack_298;
          local_1b8 = (WirePointer *)local_2c0._16_8_;
          uStack_1b0 = uStack_2a8;
          local_1c8 = (BuilderArena *)local_2c0._0_8_;
          pCStack_1c0 = (CapTableBuilder *)local_2c0._8_8_;
          field_05._8_8_ = local_2c0._8_8_;
          field_05.parent.super_Schema.raw = (Schema)(Schema)local_2c0._0_8_;
          field_05.proto._reader.segment = (SegmentReader *)local_2c0._16_8_;
          field_05.proto._reader.capTable = (CapTableReader *)uStack_2a8;
          field_05.proto._reader.data = (void *)local_2a0;
          field_05.proto._reader.pointers = (WirePointer *)uStack_298;
          field_05.proto._reader.dataSize = (undefined4)local_290;
          field_05.proto._reader.pointerCount = local_290._4_2_;
          field_05.proto._reader._38_2_ = local_290._6_2_;
          field_05.proto._reader._40_8_ = uStack_288;
          disown(&local_308,&local_238,field_05);
          field_06._8_8_ = pCStack_1c0;
          field_06.parent.super_Schema.raw = (Schema)(Schema)local_1c8;
          field_06.proto._reader.segment = (SegmentReader *)local_1b8;
          field_06.proto._reader.capTable = (CapTableReader *)uStack_1b0;
          field_06.proto._reader.data = (void *)local_1a8;
          field_06.proto._reader.pointers = (WirePointer *)uStack_1a0;
          field_06.proto._reader.dataSize = (undefined4)local_198;
          field_06.proto._reader.pointerCount = local_198._4_2_;
          field_06.proto._reader._38_2_ = local_198._6_2_;
          field_06.proto._reader._40_8_ = uStack_190;
          adopt(&local_98,field_06,&local_308);
          if (CONCAT17(local_308.builder.segment._7_1_,local_308.builder.segment._0_7_) != 0) {
            capnp::_::OrphanBuilder::euthanize(&local_308.builder);
          }
        }
        uVar11 = uVar11 + 1;
      } while ((uint)auStack_350._56_4_ != uVar11);
    }
    Orphan<capnp::DynamicStruct>::get((Builder *)auStack_350,&local_c0);
    pOVar6 = local_280;
    local_358._0_4_ = STRUCT;
    Orphan<capnp::DynamicValue>::Orphan(local_280,(Builder *)local_358,&local_c0.builder);
    if (local_c0.builder.segment == (SegmentBuilder *)0x0) {
      return pOVar6;
    }
    capnp::_::OrphanBuilder::euthanize(&local_c0.builder);
    return pOVar6;
  }
  if (sVar9 != 0) {
LAB_001c7a98:
    kj::_::unreachable();
  }
  TVar13 = StructSchema::Field::getType(&field);
  uVar12 = 0xe;
  if (((undefined1  [16])TVar13 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    uVar12 = TVar13._0_4_;
  }
  if (0x12 < (ushort)uVar12) goto LAB_001c7a98;
  if ((0x8fffU >> (uVar12 & 0x1f) & 1) == 0) {
    field_07.proto._reader.pointerCount = field.proto._reader.pointerCount;
    field_07.proto._reader._38_2_ = field.proto._reader._38_2_;
    field_07.proto._reader.dataSize = field.proto._reader.dataSize;
    field_07.index = field.index;
    field_07._12_4_ = field._12_4_;
    field_07.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
    field_07.proto._reader.segment = field.proto._reader.segment;
    field_07.proto._reader.capTable = field.proto._reader.capTable;
    field_07.proto._reader.data = field.proto._reader.data;
    field_07.proto._reader.pointers = field.proto._reader.pointers;
    field_07.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
    field_07.proto._reader._44_4_ = field.proto._reader._44_4_;
    get((Builder *)local_358,this,field_07);
    if (local_358._0_4_ == CAPABILITY) {
      local_278.raw._0_4_ = CAPABILITY;
      (**(code **)(*(long *)auStack_350._8_8_ + 0x20))();
      aStack_270.textValue.content.size_ = auStack_350._16_8_;
    }
    else {
      aStack_270._40_8_ = auStack_350._40_8_;
      aStack_270._48_8_ = auStack_350._48_8_;
      aStack_270.listValue.builder.capTable = (CapTableBuilder *)auStack_350._24_8_;
      aStack_270.listValue.builder.ptr = (byte *)auStack_350._32_8_;
      aStack_270.structValue.builder.segment = (SegmentBuilder *)auStack_350._8_8_;
      aStack_270.textValue.content.size_ = auStack_350._16_8_;
      local_278.raw = (RawBrandedSchema *)local_358;
      aStack_270.anyPointerValue.builder.segment = (SegmentBuilder *)auStack_350._0_8_;
    }
    if (SVar3 < 0x40) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)*(uint *)((long)pvVar2 + 4);
    }
    local_2c0._16_8_ = (this->builder).pointers + uVar11;
    local_2c0._0_8_ = (this->builder).segment;
    local_2c0._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::disown((OrphanBuilder *)&local_308,(PointerBuilder *)local_2c0);
    Orphan<capnp::DynamicValue>::Orphan
              (__return_storage_ptr__,(Builder *)&local_278,(OrphanBuilder *)&local_308);
    if (CONCAT44(local_308.field_1.intValue._4_4_,local_308.field_1.intValue._0_4_) != 0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_308);
    }
    uVar5 = aStack_270.textValue.content.ptr;
    if (((Type)local_278.raw == CAPABILITY) && (aStack_270._8_8_ != (SegmentBuilder *)0x0)) {
      aStack_270.textValue.content.ptr = (char *)0x0;
      (*(code *)(((aStack_270.anyPointerValue.builder.segment)->super_SegmentReader).arena)->
                _vptr_Arena)
                (aStack_270.intValue,
                 (char *)(uVar5 + (long)(((SegmentBuilder *)uVar5)->super_SegmentReader).arena[-2].
                                        _vptr_Arena));
    }
    uVar5 = auStack_350._8_8_;
    if (local_358._0_4_ != CAPABILITY) {
      return __return_storage_ptr__;
    }
    if ((SegmentBuilder *)auStack_350._8_8_ == (SegmentBuilder *)0x0) {
      return __return_storage_ptr__;
    }
    auStack_350._8_8_ = (char *)0x0;
    (*(code *)**(undefined8 **)auStack_350._0_8_)
              (auStack_350._0_8_,(char *)(uVar5 + *(long *)(*(long *)uVar5 + -0x10)));
    return __return_storage_ptr__;
  }
  field_00.proto._reader.pointerCount = field.proto._reader.pointerCount;
  field_00.proto._reader._38_2_ = field.proto._reader._38_2_;
  field_00.proto._reader.dataSize = field.proto._reader.dataSize;
  field_00.index = field.index;
  field_00._12_4_ = field._12_4_;
  field_00.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
  field_00.proto._reader.segment = field.proto._reader.segment;
  field_00.proto._reader.capTable = field.proto._reader.capTable;
  field_00.proto._reader.data = field.proto._reader.data;
  field_00.proto._reader.pointers = field.proto._reader.pointers;
  field_00.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
  field_00.proto._reader._44_4_ = field.proto._reader._44_4_;
  get(&local_208,this,field_00);
  uVar5 = local_208.field_1.textValue.content.ptr;
  local_358._0_4_ = local_208.type;
  auStack_350._16_8_ = (SegmentReader *)0x0;
  auStack_350._24_8_ = (SegmentBuilder *)0x0;
  auStack_350._32_8_ = (CapTableBuilder *)0x0;
  auStack_350._40_8_ = (WirePointer *)0x0;
  switch(local_208.type) {
  case BOOL:
    auStack_350[0] = local_208.field_1.boolValue;
    break;
  case FLOAT:
    auStack_350._4_4_ = local_208.field_1.intValue._4_4_;
    auStack_350._0_4_ = local_208.field_1.intValue._0_4_;
    break;
  default:
    goto switchD_001c7306_caseD_6;
  case LIST:
    auStack_350._4_4_ = local_208.field_1.intValue._4_4_;
    auStack_350._0_4_ = local_208.field_1.intValue._0_4_;
    auStack_350._8_8_ = local_208.field_1.textValue.content.ptr;
    break;
  case ENUM:
    auStack_350._8_2_ = local_208.field_1.enumValue.value;
  case INT:
  case UINT:
  case STRUCT:
    auStack_350._4_4_ = local_208.field_1.intValue._4_4_;
    auStack_350._0_4_ = local_208.field_1.intValue._0_4_;
    break;
  case CAPABILITY:
    auStack_350._0_8_ = local_208.field_1.textValue.content.size_;
  }
  if ((local_208.type == CAPABILITY) && (local_208.field_1._8_8_ != (SegmentBuilder *)0x0)) {
    local_208.field_1.textValue.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_208.field_1.intValue._4_4_,local_208.field_1.intValue._0_4_))
              ((undefined8 *)
               CONCAT44(local_208.field_1.intValue._4_4_,local_208.field_1.intValue._0_4_),
               (char *)(uVar5 + (long)(((SegmentBuilder *)uVar5)->super_SegmentReader).arena[-2].
                                      _vptr_Arena));
  }
switchD_001c7306_caseD_6:
  field_08.proto._reader.pointerCount = field.proto._reader.pointerCount;
  field_08.proto._reader._38_2_ = field.proto._reader._38_2_;
  field_08.proto._reader.dataSize = field.proto._reader.dataSize;
  field_08.index = field.index;
  field_08._12_4_ = field._12_4_;
  field_08.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
  field_08.proto._reader.segment = field.proto._reader.segment;
  field_08.proto._reader.capTable = field.proto._reader.capTable;
  field_08.proto._reader.data = field.proto._reader.data;
  field_08.proto._reader.pointers = field.proto._reader.pointers;
  field_08.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
  field_08.proto._reader._44_4_ = field.proto._reader._44_4_;
  clear(this,field_08);
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = auStack_350._8_8_;
  *(undefined1 (*) [8])__return_storage_ptr__ = local_358;
  (__return_storage_ptr__->field_1).intValue = auStack_350._0_8_;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)auStack_350._24_8_;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)auStack_350._32_8_;
  (__return_storage_ptr__->builder).location = (word *)auStack_350._40_8_;
  (__return_storage_ptr__->builder).tag.content = auStack_350._16_8_;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> DynamicStruct::Builder::disown(StructSchema::Field field) {
  // We end up calling get(field) below, so we don't need to validate `field` here.

  auto proto = field.getProto();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      switch (field.getType().which()) {
        case schema::Type::VOID:
        case schema::Type::BOOL:
        case schema::Type::INT8:
        case schema::Type::INT16:
        case schema::Type::INT32:
        case schema::Type::INT64:
        case schema::Type::UINT8:
        case schema::Type::UINT16:
        case schema::Type::UINT32:
        case schema::Type::UINT64:
        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
        case schema::Type::ENUM: {
          auto result = Orphan<DynamicValue>(get(field), _::OrphanBuilder());
          clear(field);
          return kj::mv(result);
        }

        case schema::Type::TEXT:
        case schema::Type::DATA:
        case schema::Type::LIST:
        case schema::Type::STRUCT:
        case schema::Type::ANY_POINTER:
        case schema::Type::INTERFACE: {
          auto value = get(field);
          return Orphan<DynamicValue>(
              value, builder.getPointerField(assumePointerOffset(slot.getOffset())).disown());
        }
      }
      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP: {
      // We have to allocate new space for the group, unfortunately.
      auto src = get(field).as<DynamicStruct>();

      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(src.getSchema());
      auto dst = result.get();

      KJ_IF_SOME(unionField, src.which()) {
        dst.adopt(unionField, src.disown(unionField));
      }

      // We need to explicitly reset the union to its default field.
      KJ_IF_SOME(unionField, src.schema.getFieldByDiscriminant(0)) {
        src.clear(unionField);
      }

      for (auto field: src.schema.getNonUnionFields()) {
        if (src.has(field)) {
          dst.adopt(field, src.disown(field));
        }
      }

      return kj::mv(result);
    }
  }

  KJ_UNREACHABLE;
}